

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall QListModel::insert(QListModel *this,int row,QStringList *labels)

{
  ulong uVar1;
  QListWidget *pQVar2;
  QListWidgetItem *pQVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)(labels->d).size;
  if (0 < (int)uVar5) {
    pQVar2 = view(this);
    if ((pQVar2 == (QListWidget *)0x0) ||
       (*(char *)(*(long *)&(pQVar2->super_QListView).super_QAbstractItemView.
                            super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8 + 0x5c0)
        != '\x01')) {
      if (row < 0) {
        iVar4 = 0;
      }
      else {
        uVar1 = (this->items).d.size;
        if ((uint)row <= uVar1) {
          uVar1 = (ulong)(uint)row;
        }
        iVar4 = (int)uVar1;
      }
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,iVar4);
      lVar6 = (long)iVar4;
      for (lVar7 = 0; (ulong)(uVar5 & 0x7fffffff) * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
        pQVar3 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem
                  (pQVar3,(QString *)((long)&(((labels->d).ptr)->d).d + lVar7),(QListWidget *)0x0,0)
        ;
        pQVar3->d->theid = (int)lVar6;
        pQVar2 = view(this);
        pQVar3->view = pQVar2;
        QList<QListWidgetItem_*>::insert(&this->items,lVar6,pQVar3);
        lVar6 = lVar6 + 1;
      }
      QAbstractItemModel::endInsertRows();
    }
    else {
      for (lVar6 = 0; (ulong)(uVar5 & 0x7fffffff) * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
        pQVar3 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem
                  (pQVar3,(QString *)((long)&(((labels->d).ptr)->d).d + lVar6),(QListWidget *)0x0,0)
        ;
        insert(this,row,pQVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::insert(int row, const QStringList &labels)
{
    const int count = labels.size();
    if (count <= 0)
        return;
    QListWidget *view = this->view();
    if (view && view->isSortingEnabled()) {
        // sorted insertion
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            insert(row, item);
        }
    } else {
        if (row < 0)
            row = 0;
        else if (row > items.size())
            row = items.size();
        beginInsertRows(QModelIndex(), row, row + count - 1);
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            item->d->theid = row;
            item->view = this->view();
            items.insert(row++, item);
        }
        endInsertRows();
    }
}